

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O0

void __thiscall vera::Shader::use(Shader *this)

{
  bool bVar1;
  GLuint GVar2;
  Shader *this_local;
  
  bVar1 = isDirty(this);
  if (bVar1) {
    load(this,&this->m_fragmentSource,&this->m_vertexSource,this->m_error_screen,false);
  }
  bVar1 = inUse(this);
  if (!bVar1) {
    GVar2 = getProgram(this);
    glUseProgram(GVar2);
  }
  this->textureIndex = 0;
  return;
}

Assistant:

void Shader::use() {
    if (isDirty())
        load(m_fragmentSource, m_vertexSource, m_error_screen, false);

    if (!inUse())
        glUseProgram(getProgram());
        
    textureIndex = 0;
}